

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

ListSchema __thiscall capnp::Type::asList(Type *this)

{
  undefined2 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined2 uVar5;
  undefined2 uVar7;
  bool bVar8;
  anon_union_8_2_eba6ea51_for_Type_5 extraout_RDX;
  Type elementType_00;
  undefined8 local_50;
  Type elementType;
  Fault local_30;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Type *this_local;
  undefined5 uVar4;
  undefined4 uVar6;
  
  f.exception._6_1_ = isList(this);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar8 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (bVar8) {
    uVar1 = this->baseType;
    uVar2 = this->listDepth;
    uVar3 = this->isImplicitParam;
    uVar5 = this->field_3;
    uVar7 = *(undefined2 *)&this->field_0x6;
    uVar6 = CONCAT22(uVar7,uVar5);
    uVar4 = CONCAT41(uVar6,uVar3);
    local_50 = (ListSchema *)CONCAT53(uVar4,CONCAT12(uVar2 + -1,uVar1));
    elementType_00.field_4.schema = extraout_RDX.schema;
    elementType_00._0_8_ = (this->field_4).schema;
    _this_local = (Type)ListSchema::of(local_50,elementType_00);
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[28]>
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x312,FAILED,"isList()","_kjCondition,\"Type::asList(): Not a list.\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [28])"Type::asList(): Not a list.");
    _this_local = (Type)ListSchema::of(VOID);
    kj::_::Debug::Fault::~Fault(&local_30);
  }
  return (ListSchema)_this_local;
}

Assistant:

ListSchema Type::asList() const {
  KJ_REQUIRE(isList(), "Type::asList(): Not a list.") {
    return ListSchema::of(schema::Type::VOID);
  }
  Type elementType = *this;
  --elementType.listDepth;
  return ListSchema::of(elementType);
}